

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

void __thiscall
boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>::on
          (reporter<boost::ext::ut::v1_1_8::printer> *this,test_end param_1)

{
  printer *ppVar1;
  colors *pcVar2;
  char local_13 [3];
  reporter<boost::ext::ut::v1_1_8::printer> *local_10;
  reporter<boost::ext::ut::v1_1_8::printer> *this_local;
  
  local_10 = this;
  if (this->fails_ < (this->asserts_).fail) {
    (this->tests_).fail = (this->tests_).fail + 1;
    local_13[2] = 10;
    ppVar1 = printer::operator<<(&this->printer_,local_13 + 2);
    pcVar2 = printer::colors(&this->printer_);
    ppVar1 = printer::operator<<(ppVar1,&pcVar2->fail);
    ppVar1 = printer::operator<<(ppVar1,(char (*) [7])"FAILED");
    pcVar2 = printer::colors(&this->printer_);
    ppVar1 = printer::operator<<(ppVar1,&pcVar2->none);
    local_13[1] = 10;
    printer::operator<<(ppVar1,local_13 + 1);
  }
  else {
    (this->tests_).pass = (this->tests_).pass + 1;
    pcVar2 = printer::colors(&this->printer_);
    ppVar1 = printer::operator<<(&this->printer_,&pcVar2->pass);
    ppVar1 = printer::operator<<(ppVar1,(char (*) [7])"PASSED");
    pcVar2 = printer::colors(&this->printer_);
    ppVar1 = printer::operator<<(ppVar1,&pcVar2->none);
    local_13[0] = '\n';
    printer::operator<<(ppVar1,local_13);
  }
  return;
}

Assistant:

auto on(events::test_end) -> void {
      if (asserts_.fail > fails_) {
        ++tests_.fail;
        printer_ << '\n'
                 << printer_.colors().fail << "FAILED" << printer_.colors().none
                 << '\n';
      } else {
        ++tests_.pass;
        printer_ << printer_.colors().pass << "PASSED" << printer_.colors().none
                 << '\n';
      }
    }